

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

size_t __thiscall ON_FixedSizePool::SizeOfPool(ON_FixedSizePool *this)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  
  if ((long *)this->m_first_block == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    plVar4 = (long *)this->m_first_block;
    do {
      plVar1 = (long *)*plVar4;
      if (this->m_sizeof_element == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = ((plVar4[1] - (long)plVar4) - 0x10U) / this->m_sizeof_element;
      }
      lVar3 = lVar3 + uVar2;
      plVar4 = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return lVar3 * this->m_sizeof_element;
}

Assistant:

size_t ON_FixedSizePool::SizeOfPool() const
{
  size_t element_count = 0;
  void* next = m_first_block;
  for (void* blk = next; nullptr != blk; blk = next)
  {
    next = *((void**)blk);
    element_count += BlockElementCapacity(blk);
  }
  return element_count * m_sizeof_element;
}